

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Expression> __thiscall minja::Parser::parseStringConcat(Parser *this)

{
  int iVar1;
  runtime_error *prVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Parser *in_RSI;
  shared_ptr<minja::Expression> sVar4;
  shared_ptr<minja::Expression> right;
  undefined1 local_48 [16];
  string local_38;
  
  parseMathPow(this);
  if ((this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Expected left side of \'string concat\' expression");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (parseStringConcat()::concat_tok_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&parseStringConcat()::concat_tok_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseStringConcat()::concat_tok_abi_cxx11_,"~(?!\\})",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseStringConcat()::concat_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseStringConcat()::concat_tok_abi_cxx11_);
    }
  }
  consumeToken((string *)(local_48 + 0x10),in_RSI,&parseStringConcat()::concat_tok_abi_cxx11_,Strip)
  ;
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  _Var3._M_pi = extraout_RDX;
  if (local_38._M_string_length != 0) {
    parseLogicalAnd((Parser *)&right);
    if (right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"Expected right side of \'string concat\' expression");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    get_location((Location *)(local_48 + 0x10),in_RSI);
    std::
    make_shared<minja::BinaryOpExpr,minja::Location,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op>
              ((Location *)local_48,(shared_ptr<minja::Expression> *)(local_48 + 0x10),
               (shared_ptr<minja::Expression> *)this,(Op *)&right);
    std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<minja::BinaryOpExpr,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::Expression>)
         sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseStringConcat() {
        auto left = parseMathPow();
        if (!left) throw std::runtime_error("Expected left side of 'string concat' expression");

        static std::regex concat_tok(R"(~(?!\}))");
        if (!consumeToken(concat_tok).empty()) {
            auto right = parseLogicalAnd();
            if (!right) throw std::runtime_error("Expected right side of 'string concat' expression");
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), BinaryOpExpr::Op::StrConcat);
        }
        return left;
    }